

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Maj3_ManExactSynthesis(int nVars,int nNodes,int fVerbose,Vec_Int_t *vLevels)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Maj3_Man_t *p;
  int iVar8;
  long lVar9;
  uint uVar10;
  char *__format;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  int iMint;
  int pFanins [3];
  timespec ts;
  uint local_d4;
  long local_d0;
  int local_c8;
  int local_c4 [3];
  timespec local_b8;
  long local_a8;
  
  local_c8 = fVerbose;
  iVar5 = clock_gettime(3,&local_b8);
  if (iVar5 < 0) {
    local_d0 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8.tv_nsec),8);
    local_d0 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_b8.tv_sec * -1000000;
  }
  local_d4 = 0;
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",(ulong)(uint)nVars,
         nNodes);
  p = Maj3_ManAlloc(nVars,nNodes,vLevels);
  if (local_d4 != 0xffffffff) {
    uVar17 = 0;
    uVar10 = 0;
    do {
      iVar5 = clock_gettime(3,&local_b8);
      if (iVar5 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_b8.tv_sec * -1000000;
      }
      iVar5 = Maj3_ManAddCnf(p,local_d4);
      if (iVar5 == 0) {
LAB_005a4795:
        bVar18 = false;
      }
      else {
        while (iVar5 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0), iVar5 == 1) {
          iVar5 = Maj3_ManAddConstraintsLazy(p);
          if (iVar5 == 0) {
            iVar5 = 1;
            break;
          }
          if (iVar5 == -1) {
            puts("Became UNSAT after adding lazy constraints.");
            iVar5 = -1;
            break;
          }
          uVar10 = uVar10 + iVar5;
        }
        if (local_c8 != 0) {
          printf("Iter %3d : ",uVar17);
          Extra_PrintBinary(_stdout,&local_d4,p->nVars);
          printf("  Var =%5d  ",(ulong)(uint)p->iVar);
          uVar6 = bmcg_sat_solver_clausenum(p->pSat);
          printf("Cla =%6d  ",(ulong)uVar6);
          uVar6 = bmcg_sat_solver_conflictnum(p->pSat);
          printf("Conf =%9d  ",(ulong)uVar6);
          printf("Lazy =%9d  ",(ulong)uVar10);
          iVar8 = 3;
          iVar7 = clock_gettime(3,&local_b8);
          if (iVar7 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
          }
          Abc_Print(iVar8,"%s =","Time");
          Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar16 + lVar9) / 1000000.0);
        }
        if (iVar5 == -1) {
          puts("The problem has no solution.");
          goto LAB_005a4795;
        }
        iVar5 = p->nVars;
        iVar7 = p->nObjs;
        if (iVar5 < iVar7) {
          do {
            iVar7 = Maj3_ManFindFanin(p,iVar5,local_c4);
            if (iVar7 != 3) {
              __assert_fail("nFanins == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                            ,0xdf,"int Maj3_ManEval(Maj3_Man_t *)");
            }
            pVVar2 = p->vInfo;
            uVar6 = p->nWords;
            lVar9 = 0;
            do {
              uVar11 = local_c4[lVar9] * uVar6;
              if (((int)uVar11 < 0) || (iVar7 = pVVar2->nSize, iVar7 <= (int)uVar11))
              goto LAB_005a48f1;
              pwVar3 = pVVar2->pArray;
              (&local_b8.tv_sec)[lVar9] = (__time_t)(pwVar3 + uVar11);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            if (((int)(uVar6 * iVar5) < 0) || (iVar7 <= (int)(uVar6 * iVar5))) goto LAB_005a48f1;
            if (0 < (int)uVar6) {
              uVar13 = 0;
              do {
                uVar15 = *(ulong *)(local_b8.tv_nsec + uVar13 * 8);
                uVar4 = *(ulong *)(local_a8 + uVar13 * 8);
                pwVar3[uVar6 * iVar5 + uVar13] =
                     uVar4 & uVar15 | (uVar4 | uVar15) & *(ulong *)(local_b8.tv_sec + uVar13 * 8);
                uVar13 = uVar13 + 1;
              } while (uVar6 != uVar13);
            }
            iVar5 = iVar5 + 1;
            iVar7 = p->nObjs;
          } while (iVar5 < iVar7);
        }
        iVar5 = p->nVars;
        iVar8 = 1 << ((byte)iVar5 & 0x1f);
        uVar13 = 0xffffffff;
        uVar6 = 0xffffffff;
        if (iVar5 != 0x1f) {
          iVar12 = 1;
          if (1 < iVar8) {
            iVar12 = iVar8;
          }
          uVar15 = 0;
          do {
            iVar14 = (int)uVar15;
            if (iVar5 / 2 + 1 < Abc_TtBitCount8[uVar15 >> 8] + Abc_TtBitCount8[uVar15 & 0xff] ||
                Abc_TtBitCount8[uVar15 >> 8] + Abc_TtBitCount8[uVar15 & 0xff] < iVar5 / 2) {
              bVar18 = false;
            }
            else {
              uVar6 = p->nWords * iVar7;
              if ((int)uVar6 < 0) {
LAB_005a48f1:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              iVar1 = p->vInfo->nSize;
              if (((iVar1 <= (int)uVar6) || (uVar11 = p->nWords * (iVar7 + -1), (int)uVar11 < 0)) ||
                 (iVar1 <= (int)uVar11)) goto LAB_005a48f1;
              pwVar3 = p->vInfo->pArray;
              bVar18 = ((pwVar3[(ulong)uVar11 + (uVar15 >> 6)] ^
                        pwVar3[(ulong)uVar6 + (uVar15 >> 6)]) >> (uVar15 & 0x3f) & 1) != 0;
              if (bVar18) {
                uVar13 = uVar15;
              }
            }
            uVar6 = (uint)uVar13;
          } while ((!bVar18) && (uVar15 = (ulong)(iVar14 + 1), iVar12 + -1 != iVar14));
        }
        if (iVar8 <= (int)uVar6) {
          __assert_fail("iMint < (1 << p->nVars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0xfa,"int Maj3_ManEval(Maj3_Man_t *)");
        }
        bVar18 = true;
        local_d4 = uVar6;
      }
    } while ((bVar18) && (uVar17 = (ulong)((int)uVar17 + 1), local_d4 != 0xffffffff));
  }
  if (local_d4 == 0xffffffff) {
    printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
           (ulong)(uint)p->nNodes);
    uVar10 = p->nObjs;
    if (p->nVars < (int)uVar10) {
      do {
        uVar10 = uVar10 - 1;
        printf("%02d = MAJ(",(ulong)uVar10);
        iVar5 = Maj3_ManFindFanin(p,uVar10,(int *)&local_b8);
        if (iVar5 != 3) {
          __assert_fail("nFanins == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0xcb,"void Maj3_ManPrintSolution(Maj3_Man_t *)");
        }
        lVar9 = 0;
        do {
          uVar6 = *(uint *)((long)&local_b8.tv_sec + lVar9 * 4);
          if (((int)uVar6 < 0) || (p->nVars <= (int)uVar6)) {
            __format = " %02d";
          }
          else {
            uVar6 = uVar6 + 0x61;
            __format = " %c";
          }
          printf(__format,(ulong)uVar6);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        puts(" )");
      } while (p->nVars < (int)uVar10);
    }
  }
  Maj3_ManFree(p);
  iVar7 = 3;
  iVar5 = clock_gettime(3,&local_b8);
  if (iVar5 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
  }
  lVar9 = lVar9 + local_d0;
  Abc_Print(iVar7,"%s =","Total runtime");
  Abc_Print(iVar7,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  return (int)(local_d4 == 0xffffffff);
}

Assistant:

int Maj3_ManExactSynthesis( int nVars, int nNodes, int fVerbose, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p;  abctime clkTotal = Abc_Clock();
    int i, status, nLazy, nLazyAll = 0, iMint = 0;
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", nVars, nNodes );
    p = Maj3_ManAlloc( nVars, nNodes, vLevels );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj3_ManAddCnf( p, iMint ) )
            break;
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            nLazy = Maj3_ManAddConstraintsLazy( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            printf( "Lazy =%9d  ", nLazyAll );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj3_ManEval( p );
    }
    if ( iMint == -1 )
        Maj3_ManPrintSolution( p );
    Maj3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}